

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::HttpServer::HttpServer
          (HttpServer *this,Timer *timer,HttpHeaderTable *requestHeaderTable,HttpService *service,
          Settings *settings)

{
  SourceLocation location;
  undefined8 in_stack_ffffffffffffff00;
  SourceLocation local_d0;
  PromiseFulfillerPair<void> local_b8;
  HttpServerSettings local_90;
  HttpService *local_50;
  OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)>_>
  local_48;
  Settings *local_30;
  Settings *settings_local;
  HttpService *service_local;
  HttpHeaderTable *requestHeaderTable_local;
  Timer *timer_local;
  HttpServer *this_local;
  
  local_50 = service;
  local_30 = settings;
  settings_local = (Settings *)service;
  service_local = (HttpService *)requestHeaderTable;
  requestHeaderTable_local = (HttpHeaderTable *)timer;
  timer_local = (Timer *)this;
  OneOf<kj::HttpService*,kj::Function<kj::Own<kj::HttpService,decltype(nullptr)>(kj::AsyncIoStream&)>>
  ::OneOf<kj::HttpService*,int>
            ((OneOf<kj::HttpService*,kj::Function<kj::Own<kj::HttpService,decltype(nullptr)>(kj::AsyncIoStream&)>>
              *)&local_48,&local_50);
  HttpServerSettings::HttpServerSettings(&local_90,settings);
  SourceLocation::SourceLocation
            (&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"HttpServer",0x1fbc,0x12);
  location.function = (char *)local_d0._16_8_;
  location.fileName = local_d0.function;
  location.lineNumber = (int)in_stack_ffffffffffffff00;
  location.columnNumber = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  newPromiseAndFulfiller<void>(location);
  HttpServer(this,timer,requestHeaderTable,&local_48,&local_90,&local_b8);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair(&local_b8);
  OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)>_>
  ::~OneOf(&local_48);
  return;
}

Assistant:

HttpServer::HttpServer(kj::Timer& timer, const HttpHeaderTable& requestHeaderTable,
                       HttpService& service, Settings settings)
    : HttpServer(timer, requestHeaderTable, &service, settings,
                 kj::newPromiseAndFulfiller<void>()) {}